

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_nvector.c
# Opt level: O0

int N_VLinearCombinationVectorArray(int nvec,int nsum,realtype *c,N_Vector **X,N_Vector *Z)

{
  N_Vector *__ptr;
  N_Vector *Y;
  realtype ONE;
  int local_38;
  int ier;
  int j;
  int i;
  N_Vector *Z_local;
  N_Vector **X_local;
  realtype *c_local;
  int nsum_local;
  int nvec_local;
  
  if ((*Z)->ops->nvlinearcombinationvectorarray ==
      (_func_int_int_int_realtype_ptr_N_Vector_ptr_ptr_N_Vector_ptr *)0x0) {
    if ((*Z)->ops->nvlinearcombination == (_func_int_int_realtype_ptr_N_Vector_ptr_N_Vector *)0x0) {
      for (ier = 0; ier < nvec; ier = ier + 1) {
        (*(*Z)->ops->nvscale)(*c,(*X)[ier],Z[ier]);
        for (local_38 = 1; local_38 < nsum; local_38 = local_38 + 1) {
          (*(*Z)->ops->nvlinearsum)(c[local_38],X[local_38][ier],1.0,Z[ier],Z[ier]);
        }
      }
      nsum_local = 0;
    }
    else {
      __ptr = (N_Vector *)malloc((long)nsum << 3);
      for (ier = 0; ier < nvec; ier = ier + 1) {
        for (local_38 = 0; local_38 < nsum; local_38 = local_38 + 1) {
          __ptr[local_38] = X[local_38][ier];
        }
        ONE._4_4_ = (*(*Z)->ops->nvlinearcombination)(nsum,c,__ptr,Z[ier]);
        if (ONE._4_4_ != 0) break;
      }
      free(__ptr);
      nsum_local = ONE._4_4_;
    }
  }
  else {
    nsum_local = (*(*Z)->ops->nvlinearcombinationvectorarray)(nvec,nsum,c,X,Z);
  }
  return nsum_local;
}

Assistant:

int N_VLinearCombinationVectorArray(int nvec, int nsum, realtype* c, N_Vector** X,
                                    N_Vector* Z)
{
  int       i, j, ier;
  realtype  ONE=RCONST(1.0);
  N_Vector* Y=NULL;

  if (Z[0]->ops->nvlinearcombinationvectorarray != NULL) {
    
    ier = Z[0]->ops->nvlinearcombinationvectorarray(nvec, nsum, c, X, Z);
    return(ier);

  } else if (Z[0]->ops->nvlinearcombination != NULL ) {
    
    /* allocate array of vectors */
    Y = (N_Vector *) malloc(nsum * sizeof(N_Vector));

    for (i=0; i<nvec; i++) {

      for (j=0; j<nsum; j++) {
        Y[j] = X[j][i];
      }

      ier = Z[0]->ops->nvlinearcombination(nsum, c, Y, Z[i]);
      if (ier != 0) break;
    }
    
    /* free array of vectors */
    free(Y);

    return(ier);

  } else {

    for (i=0; i<nvec; i++) {
      Z[0]->ops->nvscale(c[0], X[0][i], Z[i]);
      for (j=1; j<nsum; j++) {
        Z[0]->ops->nvlinearsum(c[j], X[j][i], ONE, Z[i], Z[i]);
      }
    }
    return(0);
  }
}